

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

xmlParserInputBufferPtr gen_xmlParserInputBufferPtr(int no,int nr)

{
  int nr_local;
  int no_local;
  
  if (no == 0) {
    _nr_local = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFilename("missing.xml",0);
  }
  else if (no == 1) {
    _nr_local = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFilename("<foo/>",0);
  }
  else if (no == 2) {
    _nr_local = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFilename("test/ent2",0);
  }
  else if (no == 3) {
    _nr_local = (xmlParserInputBufferPtr)
                xmlParserInputBufferCreateFilename("test/valid/REC-xml-19980210.xml",0);
  }
  else if (no == 4) {
    _nr_local = (xmlParserInputBufferPtr)
                xmlParserInputBufferCreateFilename("test/valid/dtds/xhtml1-strict.dtd",0);
  }
  else if (no == 5) {
    _nr_local = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFilename("http://localhost/",0);
  }
  else if (no == 6) {
    _nr_local = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFilename("http:http://http",0);
  }
  else {
    _nr_local = (xmlParserInputBufferPtr)0x0;
  }
  return _nr_local;
}

Assistant:

static xmlParserInputBufferPtr gen_xmlParserInputBufferPtr(int no, int nr ATTRIBUTE_UNUSED) {
    if (no == 0) return(xmlParserInputBufferCreateFilename("missing.xml", XML_CHAR_ENCODING_NONE));
    if (no == 1) return(xmlParserInputBufferCreateFilename("<foo/>", XML_CHAR_ENCODING_NONE));
    if (no == 2) return(xmlParserInputBufferCreateFilename("test/ent2", XML_CHAR_ENCODING_NONE));
    if (no == 3) return(xmlParserInputBufferCreateFilename("test/valid/REC-xml-19980210.xml", XML_CHAR_ENCODING_NONE));
    if (no == 4) return(xmlParserInputBufferCreateFilename("test/valid/dtds/xhtml1-strict.dtd", XML_CHAR_ENCODING_NONE));
    if (no == 5) return(xmlParserInputBufferCreateFilename(REMOTE1GOOD, XML_CHAR_ENCODING_NONE));
    if (no == 6) return(xmlParserInputBufferCreateFilename(REMOTE1BAD, XML_CHAR_ENCODING_NONE));
    return(NULL);
}